

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O0

void duckdb_brotli::BrotliStoreMetaBlockTrivial
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               int is_last,BrotliEncoderParams *params,Command *commands,size_t n_commands,
               size_t *storage_ix,uint8_t *storage)

{
  HistogramLiteral *pHVar1;
  size_t in_RCX;
  uint32_t *in_RDX;
  uint8_t *in_RSI;
  size_t in_R8;
  int in_R9D;
  size_t *unaff_retaddr;
  uint8_t *in_stack_00000008;
  Command *in_stack_00000010;
  size_t in_stack_00000018;
  size_t *in_stack_00000020;
  uint8_t *in_stack_00000028;
  uint32_t num_distance_symbols;
  MetablockArena *arena;
  uint64_t v;
  uint8_t *p;
  size_t in_stack_ffffffffffffff08;
  uint32_t *lit_bits;
  MemoryManager *in_stack_ffffffffffffff10;
  MemoryManager *m_00;
  uint8_t *in_stack_ffffffffffffff18;
  size_t *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  int is_final_block;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 uVar2;
  HistogramLiteral *pHVar3;
  undefined4 in_stack_ffffffffffffff58;
  
  is_final_block = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  pHVar1 = (HistogramLiteral *)BrotliAllocate(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  uVar2 = *(undefined4 *)(in_stack_00000008 + 0x40);
  StoreCompressedMetaBlockHeader
            (is_final_block,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  pHVar3 = pHVar1;
  memset(pHVar1,0,0x400);
  pHVar1->total_count_ = 0;
  pHVar1->bit_cost_ = INFINITY;
  pHVar1 = pHVar3;
  memset(pHVar3 + 1,0,0xb00);
  pHVar3[3].data_[0xb8] = 0;
  pHVar3[3].data_[0xb9] = 0;
  pHVar3[3].data_[0xba] = 0;
  pHVar3[3].data_[0xbb] = 0x7ff00000;
  pHVar3 = pHVar1;
  memset(pHVar1[3].data_ + 0xbc,0,0x880);
  pHVar1[5].data_[0xd4] = 0;
  pHVar1[5].data_[0xd5] = 0;
  pHVar1[5].data_[0xd6] = 0;
  pHVar1[5].data_[0xd7] = 0x7ff00000;
  BuildHistograms(in_RSI,(size_t)in_RDX,in_R8,in_stack_00000010,in_stack_00000018,pHVar3,
                  (HistogramCommand *)(pHVar3 + 1),(HistogramDistance *)(pHVar3[3].data_ + 0xbc));
  *(ulong *)(in_stack_00000028 + (*in_stack_00000020 >> 3)) =
       0L << ((byte)*in_stack_00000020 & 7) |
       (ulong)(byte)*(ulong *)(in_stack_00000028 + (*in_stack_00000020 >> 3));
  *in_stack_00000020 = *in_stack_00000020 + 0xd;
  BuildAndStoreHuffmanTree
            (in_RDX,in_RCX,in_R8,(HuffmanTree *)CONCAT44(in_R9D,in_stack_ffffffffffffff58),
             (uint8_t *)pHVar3,(uint16_t *)CONCAT44(uVar2,in_stack_ffffffffffffff48),unaff_retaddr,
             in_stack_00000008);
  BuildAndStoreHuffmanTree
            (in_RDX,in_RCX,in_R8,(HuffmanTree *)CONCAT44(in_R9D,in_stack_ffffffffffffff58),
             (uint8_t *)pHVar3,(uint16_t *)CONCAT44(uVar2,in_stack_ffffffffffffff48),unaff_retaddr,
             in_stack_00000008);
  BuildAndStoreHuffmanTree
            (in_RDX,in_RCX,in_R8,(HuffmanTree *)CONCAT44(in_R9D,in_stack_ffffffffffffff58),
             (uint8_t *)pHVar3,(uint16_t *)CONCAT44(uVar2,in_stack_ffffffffffffff48),unaff_retaddr,
             in_stack_00000008);
  lit_bits = pHVar3[6].data_ + 0x14;
  m_00 = (MemoryManager *)(pHVar3[6].data_ + 0x94);
  StoreDataWithHuffmanCodes
            (in_RSI,(size_t)in_RDX,in_R8,in_stack_00000010,in_stack_00000018,
             (uint8_t *)(pHVar3[5].data_ + 0xd8),(uint16_t *)lit_bits,(uint8_t *)m_00,
             (uint16_t *)(pHVar3[7].data_ + 0x40),(uint8_t *)(pHVar3[8].data_ + 0x9c),
             (uint16_t *)(pHVar3[8].data_ + 0xbf),in_stack_00000020,in_stack_00000028);
  BrotliFree(m_00,lit_bits);
  if (in_R9D != 0) {
    JumpToByteBoundary(in_stack_00000020,in_stack_00000028);
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliStoreMetaBlockTrivial(MemoryManager* m,
    const uint8_t* input, size_t start_pos, size_t length, size_t mask,
    BROTLI_BOOL is_last, const BrotliEncoderParams* params,
    const Command* commands, size_t n_commands,
    size_t* storage_ix, uint8_t* storage) {
  MetablockArena* arena = BROTLI_ALLOC(m, MetablockArena, 1);
  uint32_t num_distance_symbols = params->dist.alphabet_size_max;
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(arena)) return;

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  HistogramClearLiteral(&arena->lit_histo);
  HistogramClearCommand(&arena->cmd_histo);
  HistogramClearDistance(&arena->dist_histo);

  BuildHistograms(input, start_pos, mask, commands, n_commands,
                  &arena->lit_histo, &arena->cmd_histo, &arena->dist_histo);

  BrotliWriteBits(13, 0, storage_ix, storage);

  BuildAndStoreHuffmanTree(arena->lit_histo.data_, BROTLI_NUM_LITERAL_SYMBOLS,
                           BROTLI_NUM_LITERAL_SYMBOLS, arena->tree,
                           arena->lit_depth, arena->lit_bits,
                           storage_ix, storage);
  BuildAndStoreHuffmanTree(arena->cmd_histo.data_, BROTLI_NUM_COMMAND_SYMBOLS,
                           BROTLI_NUM_COMMAND_SYMBOLS, arena->tree,
                           arena->cmd_depth, arena->cmd_bits,
                           storage_ix, storage);
  BuildAndStoreHuffmanTree(arena->dist_histo.data_,
                           MAX_SIMPLE_DISTANCE_ALPHABET_SIZE,
                           num_distance_symbols, arena->tree,
                           arena->dist_depth, arena->dist_bits,
                           storage_ix, storage);
  StoreDataWithHuffmanCodes(input, start_pos, mask, commands,
                            n_commands, arena->lit_depth, arena->lit_bits,
                            arena->cmd_depth, arena->cmd_bits,
                            arena->dist_depth, arena->dist_bits,
                            storage_ix, storage);
  BROTLI_FREE(m, arena);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}